

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_strip_final_slash(char *t)

{
  size_t sVar1;
  long lVar2;
  
  if (*t != '\0') {
    sVar1 = strlen(t);
    lVar2 = sVar1 - 1;
    if (((t[sVar1 - 1] == '\\') || (t[sVar1 - 1] == '/')) && ((lVar2 != 2 || (t[1] != ':')))) {
      t[lVar2] = '\0';
    }
    if (t[lVar2] == '\\') {
      t[lVar2] = '/';
    }
  }
  return t;
}

Assistant:

char *stb_strip_final_slash(char *t)
{
   if (t[0]) {
      char *z = t + strlen(t) - 1;
      // *z is the last character
      if (*z == '\\' || *z == '/')
         if (z != t+2 || t[1] != ':') // but don't strip it if it's e.g. "c:/"
            *z = 0;
      if (*z == '\\')
         *z = '/'; // canonicalize to make sure it matches db
   }
   return t;
}